

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

TypeT __thiscall
wasm::WATParser::anon_unknown_11::ParseTypeDefsCtx::makeTupleType
          (ParseTypeDefsCtx *this,vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  TypeBuilder *this_00;
  Type TVar1;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_30;
  
  this_00 = this->builder;
  Tuple::Tuple((Tuple *)&local_30,types);
  TVar1 = TypeBuilder::getTempTupleType(this_00,(Tuple *)&local_30);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_30);
  return (TypeT)TVar1.id;
}

Assistant:

TypeT makeTupleType(const std::vector<Type> types) {
    return builder.getTempTupleType(types);
  }